

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

string * __thiscall
Assimp::CFIReaderImpl::parseIdentifyingStringOrIndex
          (CFIReaderImpl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringTable)

{
  pointer pbVar1;
  size_t sVar2;
  string *psVar3;
  DeadlyImportError *this_00;
  string local_30;
  
  if ((long)this->dataEnd - (long)this->dataP < 1) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
LAB_00638a2a:
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((char)*this->dataP < '\0') {
    sVar2 = parseInt2(this);
    pbVar1 = (stringTable->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(stringTable->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= sVar2) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_00638a2a;
    }
    psVar3 = pbVar1 + sVar2;
  }
  else {
    parseNonEmptyOctetString2_abi_cxx11_(&local_30,this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)stringTable,
               &local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    psVar3 = (stringTable->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  return psVar3;
}

Assistant:

const std::string &parseIdentifyingStringOrIndex(std::vector<std::string> &stringTable) { // C.13
        if (dataEnd - dataP < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        uint8_t b = *dataP;
        if (b & 0x80) {
            // We have an index (C.13.4)
            size_t index = parseInt2();
            if (index >= stringTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return stringTable[index];
        }
        else {
            // We have a string (C.13.3)
            stringTable.push_back(parseNonEmptyOctetString2());
            return stringTable.back();
        }
    }